

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O2

Polygon * __thiscall nite::Polygon::operator*(Polygon *__return_storage_ptr__,Polygon *this,float c)

{
  pointer pVVar1;
  pointer pVVar2;
  int i;
  long lVar3;
  
  Polygon(__return_storage_ptr__,this);
  pVVar1 = (__return_storage_ptr__->vert).
           super__Vector_base<nite::Vec2,_std::allocator<nite::Vec2>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (__return_storage_ptr__->vert).
           super__Vector_base<nite::Vec2,_std::allocator<nite::Vec2>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (lVar3 = 0; (long)pVVar2 - (long)pVVar1 >> 3 != lVar3; lVar3 = lVar3 + 1) {
    pVVar1[lVar3].x = pVVar1[lVar3].x * c;
    pVVar1[lVar3].y = pVVar1[lVar3].y * c;
  }
  return __return_storage_ptr__;
}

Assistant:

nite::Polygon nite::Polygon::operator*(float c){
	auto mul = *this;
	for(int i = 0; i < mul.vert.size(); ++i){
		mul.vert[i].x *= c;
		mul.vert[i].y *= c;
	}
	return mul;
}